

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::to_qualifiers_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id)

{
  uint uVar1;
  mapped_type *pmVar2;
  SPIRVariable *pSVar3;
  SPIRType *pSVar4;
  Bitset *pBVar5;
  key_type local_48 [8];
  
  local_48[0].id = id;
  pmVar2 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&(this->super_Compiler).ir.meta,local_48);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pSVar3 = Compiler::maybe_get<spirv_cross::SPIRVariable>(&this->super_Compiler,id);
  if (((pSVar3 != (SPIRVariable *)0x0) && (pSVar3->storage == StorageClassWorkgroup)) &&
     ((this->backend).shared_is_implied == false)) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  pBVar5 = &(pmVar2->decoration).decoration_flags;
  (*(this->super_Compiler)._vptr_Compiler[0x2e])(local_48,this,pBVar5);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)local_48);
  if (pSVar3 != (SPIRVariable *)0x0) {
    (*(this->super_Compiler)._vptr_Compiler[0x2c])(this,pSVar3);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  pSVar4 = Compiler::expression_type(&this->super_Compiler,id);
  if (((pSVar4->image).dim != DimSubpassData) && ((pSVar4->image).sampled == 2)) {
    uVar1 = (uint)pBVar5->lower;
    if ((uVar1 >> 0x17 & 1) != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar1 = (uint)pBVar5->lower;
    }
    if ((uVar1 >> 0x13 & 1) != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar1 = (uint)pBVar5->lower;
    }
    if ((uVar1 >> 0x18 & 1) != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar1 = (uint)pBVar5->lower;
    }
    if ((uVar1 >> 0x19 & 1) != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  to_precision_qualifiers_glsl(this,id);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_qualifiers_glsl(uint32_t id)
{
	auto &flags = ir.meta[id].decoration.decoration_flags;
	string res;

	auto *var = maybe_get<SPIRVariable>(id);

	if (var && var->storage == StorageClassWorkgroup && !backend.shared_is_implied)
		res += "shared ";

	res += to_interpolation_qualifiers(flags);
	if (var)
		res += to_storage_qualifiers_glsl(*var);

	auto &type = expression_type(id);
	if (type.image.dim != DimSubpassData && type.image.sampled == 2)
	{
		if (flags.get(DecorationCoherent))
			res += "coherent ";
		if (flags.get(DecorationRestrict))
			res += "restrict ";
		if (flags.get(DecorationNonWritable))
			res += "readonly ";
		if (flags.get(DecorationNonReadable))
			res += "writeonly ";
	}

	res += to_precision_qualifiers_glsl(id);

	return res;
}